

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_date.cpp
# Opt level: O0

bool ON_GetGregorianMonthAndDayOfMonth(uint year,uint day_of_year,uint *month,uint *date)

{
  uint *puVar1;
  uint *year_day_count;
  uint dd;
  uint mm;
  uint *date_local;
  uint *month_local;
  uint day_of_year_local;
  uint year_local;
  
  year_day_count._4_4_ = 0;
  year_day_count._0_4_ = 0;
  if (0x62d < year) {
    puVar1 = YearDayCount(year);
    for (year_day_count._4_4_ = 1; year_day_count._4_4_ < 0xd;
        year_day_count._4_4_ = year_day_count._4_4_ + 1) {
      if (day_of_year <= puVar1[year_day_count._4_4_]) {
        year_day_count._0_4_ = day_of_year - puVar1[year_day_count._4_4_ - 1];
        break;
      }
    }
    if ((uint)year_day_count == 0) {
      year_day_count._4_4_ = (uint)year_day_count;
    }
  }
  if (month != (uint *)0x0) {
    *month = year_day_count._4_4_;
  }
  if (date != (uint *)0x0) {
    *date = (uint)year_day_count;
  }
  return (uint)year_day_count != 0;
}

Assistant:

bool ON_GetGregorianMonthAndDayOfMonth(
  unsigned int year,
  unsigned int day_of_year,
  unsigned int* month,
  unsigned int* date
  )
{
  unsigned int mm = 0;
  unsigned int dd = 0;
  if( year >= FIRST_GREGORIAN_YEAR )
  {
    const unsigned int* year_day_count = YearDayCount(year);
    for ( mm = 1; mm <= 12; mm++ )
    {
      if ( day_of_year <= year_day_count[mm] )
      {
        dd = day_of_year - year_day_count[mm-1];
        break;
      }
    }
    if ( 0 == dd )
      mm = dd;
  }

  if ( 0 != month )
    *month = mm;

  if ( 0 != date )
    *date = dd;

  return (0 != dd);
}